

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O0

wstring * get_one_regexp_literal_abi_cxx11_(wstring *__return_storage_ptr__,wstring_view text)

{
  bool bVar1;
  version vVar2;
  token *this;
  wostream *pwVar3;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  wstring_view wVar5;
  allocator<wchar_t> local_87;
  byte local_86;
  byte local_85;
  bool _r;
  bool _l;
  undefined1 local_78 [8];
  wstring_view regex_lit;
  lexer l;
  wstring_view text_local;
  
  l.current_token_.field_1._24_8_ = text._M_len;
  vVar2 = tested_version();
  mjs::lexer::lexer((lexer *)&regex_lit._M_str,
                    (wstring_view *)((long)&l.current_token_.field_1.text_.field_2 + 8),vVar2);
  wVar5 = mjs::lexer::get_regex_literal((lexer *)&regex_lit._M_str);
  regex_lit._M_len = (size_t)wVar5._M_str;
  local_78 = (undefined1  [8])wVar5._M_len;
  this = mjs::lexer::current_token((lexer *)&regex_lit._M_str);
  bVar1 = mjs::token::operator_cast_to_bool(this);
  local_85 = (bVar1 ^ 0xffU) & 1;
  local_86 = 1;
  if (local_85 != 1) {
    pwVar3 = std::operator<<((wostream *)&std::wcerr,"get_one_regexp_literal");
    pwVar3 = std::operator<<(pwVar3," in ");
    pwVar3 = std::operator<<(pwVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar3 = std::operator<<(pwVar3,":");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,0x8a);
    pwVar3 = std::operator<<(pwVar3,":\n");
    pwVar3 = std::operator<<(pwVar3,"!!(!l.current_token())");
    pwVar3 = std::operator<<(pwVar3," != ");
    pwVar3 = std::operator<<(pwVar3,"true");
    pwVar3 = std::operator<<(pwVar3,"\n");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,(bool)(local_85 & 1));
    pwVar3 = std::operator<<(pwVar3," != ");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,(bool)(local_86 & 1));
    pwVar3 = std::operator<<(pwVar3,"\n");
    vVar2 = tested_version();
    pbVar4 = mjs::operator<<(pwVar3,vVar2);
    std::operator<<(pbVar4,"\n");
    abort();
  }
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)__return_storage_ptr__,
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_78,&local_87);
  std::allocator<wchar_t>::~allocator(&local_87);
  mjs::lexer::~lexer((lexer *)&regex_lit._M_str);
  return __return_storage_ptr__;
}

Assistant:

std::wstring get_one_regexp_literal(std::wstring_view text) {
    lexer l{text, tested_version()};
    const auto regex_lit = l.get_regex_literal();
    REQUIRE(!l.current_token()); // Must be at end
    return std::wstring{regex_lit};
}